

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddTweak
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,TweakMethod tweak)

{
  string *file;
  pointer pbVar1;
  ostream *poVar2;
  cmScriptGeneratorIndent indent_00;
  cmInstallTargetGenerator *this_00;
  pointer file_00;
  string tws;
  ostringstream tw;
  allocator<char> local_209;
  ulong local_208;
  string local_200;
  cmInstallTargetGenerator *local_1e0;
  string *local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  string local_1c8;
  ostream local_1a8;
  
  local_208 = (ulong)(uint)indent.Level;
  file = (files->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = files;
  if ((long)(files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)file == 0x20) {
    GetDestDirPath((string *)&local_1a8,(cmInstallTargetGenerator *)os,file);
    AddTweak(this,os,indent,config,(string *)&local_1a8,tweak);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  else {
    local_1e0 = this;
    local_1d8 = config;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"${file}",&local_209);
    AddTweak(local_1e0,&local_1a8,(Indent)((int)local_208 + 2),local_1d8,&local_200,tweak);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::stringbuf::str();
    if (local_200._M_string_length != 0) {
      poVar2 = operator<<(os,(cmScriptGeneratorIndent)(int)local_208);
      std::operator<<(poVar2,"foreach(file\n");
      indent_00.Level = (int)local_208 + 4;
      pbVar1 = (local_1d0->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (file_00 = (local_1d0->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; file_00 != pbVar1;
          file_00 = file_00 + 1) {
        poVar2 = operator<<(os,indent_00);
        this_00 = (cmInstallTargetGenerator *)0x4c9036;
        poVar2 = std::operator<<(poVar2,"\"");
        GetDestDirPath(&local_1c8,this_00,file_00);
        poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
        std::operator<<(poVar2,"\"\n");
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      poVar2 = operator<<(os,indent_00);
      std::operator<<(poVar2,")\n");
      std::operator<<(os,(string *)&local_200);
      poVar2 = operator<<(os,(cmScriptGeneratorIndent)(int)local_208);
      std::operator<<(poVar2,"endforeach()\n");
    }
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddTweak(std::ostream& os, Indent indent,
                                        const std::string& config,
                                        std::vector<std::string> const& files,
                                        TweakMethod tweak)
{
  if (files.size() == 1) {
    // Tweak a single file.
    this->AddTweak(os, indent, config, this->GetDestDirPath(files[0]), tweak);
  } else {
    // Generate a foreach loop to tweak multiple files.
    std::ostringstream tw;
    this->AddTweak(tw, indent.Next(), config, "${file}", tweak);
    std::string tws = tw.str();
    if (!tws.empty()) {
      Indent indent2 = indent.Next().Next();
      os << indent << "foreach(file\n";
      for (std::string const& f : files) {
        os << indent2 << "\"" << this->GetDestDirPath(f) << "\"\n";
      }
      os << indent2 << ")\n";
      os << tws;
      os << indent << "endforeach()\n";
    }
  }
}